

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O0

CallbackInfo * __thiscall
JITTimeProfileInfo::FindCallbackInfo(JITTimeProfileInfo *this,ProfileId callSiteId)

{
  CallbackInfo *pCVar1;
  ulong local_30;
  size_t i;
  CallbackInfo *callbackInfo;
  ProfileId callSiteId_local;
  JITTimeProfileInfo *this_local;
  
  pCVar1 = GetCallbackInfo(this);
  local_30 = 0;
  while( true ) {
    if ((this->m_profileData).profiledCallbackCount <= local_30) {
      return (CallbackInfo *)0x0;
    }
    if (pCVar1[local_30].callSiteId == callSiteId) break;
    local_30 = local_30 + 1;
  }
  return pCVar1 + local_30;
}

Assistant:

Js::CallbackInfo * 
JITTimeProfileInfo::FindCallbackInfo(Js::ProfileId callSiteId) const
{
    Js::CallbackInfo * callbackInfo = GetCallbackInfo();
    for (size_t i = 0; i < m_profileData.profiledCallbackCount; ++i)
    {
        if (callbackInfo[i].callSiteId == callSiteId)
        {
            return &callbackInfo[i];
        }
    }
    return nullptr;
}